

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbwrapper_tests.cpp
# Opt level: O0

void __thiscall
dbwrapper_tests::existing_data_no_obfuscate::test_method(existing_data_no_obfuscate *this)

{
  bool bVar1;
  undefined1 uVar2;
  CDBWrapper *this_00;
  long in_FS_OFFSET;
  uint8_t key;
  unique_ptr<CDBWrapper,_std::default_delete<CDBWrapper>_> dbw;
  uint256 res3;
  uint256 in2;
  uint256 res2;
  CDBWrapper odbw;
  uint256 res;
  uint256 in;
  path ph;
  char *in_stack_fffffffffffff7a8;
  ArgsManager *in_stack_fffffffffffff7b0;
  char *in_stack_fffffffffffff7b8;
  path *in_stack_fffffffffffff7c0;
  CDBWrapper *in_stack_fffffffffffff7d0;
  RandomMixin<FastRandomContext> *in_stack_fffffffffffff7d8;
  uchar *puVar3;
  undefined7 in_stack_fffffffffffff7e0;
  undefined1 in_stack_fffffffffffff7e7;
  lazy_ostream *in_stack_fffffffffffff7e8;
  undefined7 in_stack_fffffffffffff7f0;
  undefined1 in_stack_fffffffffffff7f7;
  uchar *in_stack_fffffffffffff7f8;
  undefined7 in_stack_fffffffffffff800;
  undefined1 in_stack_fffffffffffff807;
  DBParams *in_stack_fffffffffffff908;
  CDBWrapper *in_stack_fffffffffffff910;
  undefined1 local_6e0 [16];
  undefined1 local_6d0 [16];
  const_string local_690 [2];
  lazy_ostream local_670 [2];
  assertion_result local_650 [2];
  const_string local_618 [2];
  lazy_ostream local_5f8 [2];
  assertion_result local_5d8 [2];
  const_string local_5a0 [2];
  lazy_ostream local_580 [2];
  assertion_result local_560 [2];
  const_string local_528 [2];
  lazy_ostream local_508 [2];
  assertion_result local_4e8 [2];
  undefined1 local_4b0 [16];
  undefined1 local_4a0 [64];
  const_string local_460 [2];
  lazy_ostream local_440 [2];
  assertion_result local_420 [2];
  undefined1 local_3e8 [16];
  undefined1 local_3d8 [64];
  const_string local_398 [2];
  lazy_ostream local_378 [2];
  assertion_result local_358 [2];
  const_string local_320 [2];
  lazy_ostream local_300 [2];
  assertion_result local_2e0 [2];
  undefined1 local_2a1;
  undefined1 local_298 [160];
  undefined1 local_1f8 [104];
  size_type local_190;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_188 [7];
  undefined1 local_110 [264];
  size_type local_8;
  
  local_8 = *(size_type *)(in_FS_OFFSET + 0x28);
  ArgsManager::GetDataDirBase(in_stack_fffffffffffff7b0);
  fs::operator/(in_stack_fffffffffffff7c0,in_stack_fffffffffffff7b8);
  fs::path::~path((path *)in_stack_fffffffffffff7a8);
  fs::create_directories((path *)in_stack_fffffffffffff7b0);
  fs::path::path((path *)in_stack_fffffffffffff7a8,(path *)0x5aaacf);
  local_110._168_8_ = (_Base_ptr)0x400;
  local_110[0xb0] = '\0';
  local_110[0xb1] = '\0';
  local_110[0xb2] = '\0';
  local_110[0xb3] = '\0';
  std::make_unique<CDBWrapper,DBParams>((DBParams *)in_stack_fffffffffffff7d0);
  DBParams::~DBParams((DBParams *)in_stack_fffffffffffff7a8);
  local_2a1 = 0x6b;
  RandomMixin<FastRandomContext>::rand256(in_stack_fffffffffffff7d8);
  uint256::uint256((uint256 *)in_stack_fffffffffffff7a8);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff7b8,
               (pointer)in_stack_fffffffffffff7b0,(unsigned_long)in_stack_fffffffffffff7a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff7a8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff7e8,
               (const_string *)CONCAT17(in_stack_fffffffffffff7e7,in_stack_fffffffffffff7e0),
               (size_t)in_stack_fffffffffffff7d8,(const_string *)in_stack_fffffffffffff7d0);
    std::unique_ptr<CDBWrapper,_std::default_delete<CDBWrapper>_>::operator->
              ((unique_ptr<CDBWrapper,_std::default_delete<CDBWrapper>_> *)in_stack_fffffffffffff7a8
              );
    CDBWrapper::Write<unsigned_char,uint256>
              ((CDBWrapper *)CONCAT17(in_stack_fffffffffffff7f7,in_stack_fffffffffffff7f0),
               (uchar *)in_stack_fffffffffffff7e8,
               (uint256 *)CONCAT17(in_stack_fffffffffffff7e7,in_stack_fffffffffffff7e0),
               SUB81((ulong)in_stack_fffffffffffff7d8 >> 0x38,0));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff7b8,
               SUB81((ulong)in_stack_fffffffffffff7b0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff7b8,
               (pointer)in_stack_fffffffffffff7b0,(unsigned_long)in_stack_fffffffffffff7a8);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff7b0,
               (basic_cstring<const_char> *)in_stack_fffffffffffff7a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff7b8,
               (pointer)in_stack_fffffffffffff7b0,(unsigned_long)in_stack_fffffffffffff7a8);
    in_stack_fffffffffffff7a8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_2e0,local_300,local_320,0xda,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff7a8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff7a8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff7b8,
               (pointer)in_stack_fffffffffffff7b0,(unsigned_long)in_stack_fffffffffffff7a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff7a8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff7e8,
               (const_string *)CONCAT17(in_stack_fffffffffffff7e7,in_stack_fffffffffffff7e0),
               (size_t)in_stack_fffffffffffff7d8,(const_string *)in_stack_fffffffffffff7d0);
    std::unique_ptr<CDBWrapper,_std::default_delete<CDBWrapper>_>::operator->
              ((unique_ptr<CDBWrapper,_std::default_delete<CDBWrapper>_> *)in_stack_fffffffffffff7a8
              );
    CDBWrapper::Read<unsigned_char,uint256>
              ((CDBWrapper *)CONCAT17(in_stack_fffffffffffff807,in_stack_fffffffffffff800),
               in_stack_fffffffffffff7f8,
               (uint256 *)CONCAT17(in_stack_fffffffffffff7f7,in_stack_fffffffffffff7f0));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff7b8,
               SUB81((ulong)in_stack_fffffffffffff7b0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff7b8,
               (pointer)in_stack_fffffffffffff7b0,(unsigned_long)in_stack_fffffffffffff7a8);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff7b0,
               (basic_cstring<const_char> *)in_stack_fffffffffffff7a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff7b8,
               (pointer)in_stack_fffffffffffff7b0,(unsigned_long)in_stack_fffffffffffff7a8);
    in_stack_fffffffffffff7a8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_358,local_378,local_398,0xdb,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff7a8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff7a8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff7b8,
               (pointer)in_stack_fffffffffffff7b0,(unsigned_long)in_stack_fffffffffffff7a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff7a8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff7e8,
               (const_string *)CONCAT17(in_stack_fffffffffffff7e7,in_stack_fffffffffffff7e0),
               (size_t)in_stack_fffffffffffff7d8,(const_string *)in_stack_fffffffffffff7d0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff7b0,(char (*) [1])in_stack_fffffffffffff7a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff7b8,
               (pointer)in_stack_fffffffffffff7b0,(unsigned_long)in_stack_fffffffffffff7a8);
    base_blob<256u>::ToString_abi_cxx11_((base_blob<256U> *)in_stack_fffffffffffff7b0);
    base_blob<256u>::ToString_abi_cxx11_((base_blob<256U> *)in_stack_fffffffffffff7b0);
    in_stack_fffffffffffff7b8 = "in.ToString()";
    in_stack_fffffffffffff7b0 = (ArgsManager *)local_110;
    in_stack_fffffffffffff7a8 = "res.ToString()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
              (local_3d8,local_3e8,0xdc,1,2,local_110 + 0x20);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff7a8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff7a8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff7a8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  std::unique_ptr<CDBWrapper,_std::default_delete<CDBWrapper>_>::reset
            ((unique_ptr<CDBWrapper,_std::default_delete<CDBWrapper>_> *)in_stack_fffffffffffff7a8,
             (pointer)0x5aafd5);
  fs::path::path((path *)in_stack_fffffffffffff7a8,(path *)0x5aafea);
  local_190 = 0x400;
  local_188[0]._M_local_buf[0] = '\0';
  local_188[0]._M_local_buf[1] = '\0';
  local_188[0]._M_local_buf[2] = '\x01';
  local_188[0]._M_local_buf[3] = '\0';
  CDBWrapper::CDBWrapper(in_stack_fffffffffffff910,in_stack_fffffffffffff908);
  DBParams::~DBParams((DBParams *)in_stack_fffffffffffff7a8);
  uint256::uint256((uint256 *)in_stack_fffffffffffff7a8);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff7b8,
               (pointer)in_stack_fffffffffffff7b0,(unsigned_long)in_stack_fffffffffffff7a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff7a8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff7e8,
               (const_string *)CONCAT17(in_stack_fffffffffffff7e7,in_stack_fffffffffffff7e0),
               (size_t)in_stack_fffffffffffff7d8,(const_string *)in_stack_fffffffffffff7d0);
    CDBWrapper::Read<unsigned_char,uint256>
              ((CDBWrapper *)CONCAT17(in_stack_fffffffffffff807,in_stack_fffffffffffff800),
               in_stack_fffffffffffff7f8,
               (uint256 *)CONCAT17(in_stack_fffffffffffff7f7,in_stack_fffffffffffff7f0));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff7b8,
               SUB81((ulong)in_stack_fffffffffffff7b0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff7b8,
               (pointer)in_stack_fffffffffffff7b0,(unsigned_long)in_stack_fffffffffffff7a8);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff7b0,
               (basic_cstring<const_char> *)in_stack_fffffffffffff7a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff7b8,
               (pointer)in_stack_fffffffffffff7b0,(unsigned_long)in_stack_fffffffffffff7a8);
    in_stack_fffffffffffff7a8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_420,local_440,local_460,0xe7,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff7a8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff7a8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff7b8,
               (pointer)in_stack_fffffffffffff7b0,(unsigned_long)in_stack_fffffffffffff7a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff7a8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff7e8,
               (const_string *)CONCAT17(in_stack_fffffffffffff7e7,in_stack_fffffffffffff7e0),
               (size_t)in_stack_fffffffffffff7d8,(const_string *)in_stack_fffffffffffff7d0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff7b0,(char (*) [1])in_stack_fffffffffffff7a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff7b8,
               (pointer)in_stack_fffffffffffff7b0,(unsigned_long)in_stack_fffffffffffff7a8);
    base_blob<256u>::ToString_abi_cxx11_((base_blob<256U> *)in_stack_fffffffffffff7b0);
    base_blob<256u>::ToString_abi_cxx11_((base_blob<256U> *)in_stack_fffffffffffff7b0);
    in_stack_fffffffffffff7b8 = "in.ToString()";
    in_stack_fffffffffffff7b0 = (ArgsManager *)(local_298 + 0x80);
    in_stack_fffffffffffff7a8 = "res2.ToString()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
              (local_4a0,local_4b0,0xe8,1,2,local_1f8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff7a8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff7a8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff7a8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff7b8,
               (pointer)in_stack_fffffffffffff7b0,(unsigned_long)in_stack_fffffffffffff7a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff7a8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff7e8,
               (const_string *)CONCAT17(in_stack_fffffffffffff7e7,in_stack_fffffffffffff7e0),
               (size_t)in_stack_fffffffffffff7d8,(const_string *)in_stack_fffffffffffff7d0);
    CDBWrapper::IsEmpty(in_stack_fffffffffffff7d0);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff7b8,
               SUB81((ulong)in_stack_fffffffffffff7b0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff7b8,
               (pointer)in_stack_fffffffffffff7b0,(unsigned_long)in_stack_fffffffffffff7a8);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff7b0,
               (basic_cstring<const_char> *)in_stack_fffffffffffff7a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff7b8,
               (pointer)in_stack_fffffffffffff7b0,(unsigned_long)in_stack_fffffffffffff7a8);
    in_stack_fffffffffffff7a8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_4e8,local_508,local_528,0xea,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff7a8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff7a8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff7b8,
               (pointer)in_stack_fffffffffffff7b0,(unsigned_long)in_stack_fffffffffffff7a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff7a8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff7e8,
               (const_string *)CONCAT17(in_stack_fffffffffffff7e7,in_stack_fffffffffffff7e0),
               (size_t)in_stack_fffffffffffff7d8,(const_string *)in_stack_fffffffffffff7d0);
    dbwrapper_private::GetObfuscateKey((CDBWrapper *)in_stack_fffffffffffff7a8);
    is_null_key((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff7b8);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff7b8,
               SUB81((ulong)in_stack_fffffffffffff7b0 >> 0x38,0));
    this_00 = (CDBWrapper *)boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff7b8,
               (pointer)in_stack_fffffffffffff7b0,(unsigned_long)in_stack_fffffffffffff7a8);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff7b0,
               (basic_cstring<const_char> *)in_stack_fffffffffffff7a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff7b8,
               (pointer)in_stack_fffffffffffff7b0,(unsigned_long)in_stack_fffffffffffff7a8);
    in_stack_fffffffffffff7a8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_560,local_580,local_5a0,0xeb,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff7a8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff7a8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  RandomMixin<FastRandomContext>::rand256(in_stack_fffffffffffff7d8);
  uint256::uint256((uint256 *)in_stack_fffffffffffff7a8);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff7b8,
               (pointer)in_stack_fffffffffffff7b0,(unsigned_long)in_stack_fffffffffffff7a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff7a8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff7e8,
               (const_string *)CONCAT17(in_stack_fffffffffffff7e7,in_stack_fffffffffffff7e0),
               (size_t)in_stack_fffffffffffff7d8,(const_string *)in_stack_fffffffffffff7d0);
    CDBWrapper::Write<unsigned_char,uint256>
              ((CDBWrapper *)CONCAT17(in_stack_fffffffffffff7f7,in_stack_fffffffffffff7f0),
               (uchar *)in_stack_fffffffffffff7e8,
               (uint256 *)CONCAT17(in_stack_fffffffffffff7e7,in_stack_fffffffffffff7e0),
               SUB81((ulong)in_stack_fffffffffffff7d8 >> 0x38,0));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff7b8,
               SUB81((ulong)in_stack_fffffffffffff7b0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff7b8,
               (pointer)in_stack_fffffffffffff7b0,(unsigned_long)in_stack_fffffffffffff7a8);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff7b0,
               (basic_cstring<const_char> *)in_stack_fffffffffffff7a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff7b8,
               (pointer)in_stack_fffffffffffff7b0,(unsigned_long)in_stack_fffffffffffff7a8);
    in_stack_fffffffffffff7a8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_5d8,local_5f8,local_618,0xf1,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff7a8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff7a8);
    uVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)uVar2);
  do {
    puVar3 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff7b8,
               (pointer)in_stack_fffffffffffff7b0,(unsigned_long)in_stack_fffffffffffff7a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff7a8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff7e8,
               (const_string *)CONCAT17(in_stack_fffffffffffff7e7,in_stack_fffffffffffff7e0),
               (size_t)in_stack_fffffffffffff7d8,(const_string *)in_stack_fffffffffffff7d0);
    in_stack_fffffffffffff7f7 =
         CDBWrapper::Read<unsigned_char,uint256>
                   ((CDBWrapper *)CONCAT17(uVar2,in_stack_fffffffffffff800),puVar3,
                    (uint256 *)CONCAT17(in_stack_fffffffffffff7f7,in_stack_fffffffffffff7f0));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff7b8,
               SUB81((ulong)in_stack_fffffffffffff7b0 >> 0x38,0));
    in_stack_fffffffffffff7e8 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff7b8,
               (pointer)in_stack_fffffffffffff7b0,(unsigned_long)in_stack_fffffffffffff7a8);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff7b0,
               (basic_cstring<const_char> *)in_stack_fffffffffffff7a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff7b8,
               (pointer)in_stack_fffffffffffff7b0,(unsigned_long)in_stack_fffffffffffff7a8);
    in_stack_fffffffffffff7a8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_650,local_670,local_690,0xf2,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff7a8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff7a8);
    in_stack_fffffffffffff7e7 = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_fffffffffffff7e7);
  do {
    puVar3 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff7b8,
               (pointer)in_stack_fffffffffffff7b0,(unsigned_long)in_stack_fffffffffffff7a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff7a8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff7e8,
               (const_string *)CONCAT17(in_stack_fffffffffffff7e7,in_stack_fffffffffffff7e0),
               (size_t)puVar3,(const_string *)in_stack_fffffffffffff7d0);
    in_stack_fffffffffffff7d0 = (CDBWrapper *)boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff7b0,(char (*) [1])in_stack_fffffffffffff7a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff7b8,
               (pointer)in_stack_fffffffffffff7b0,(unsigned_long)in_stack_fffffffffffff7a8);
    base_blob<256u>::ToString_abi_cxx11_((base_blob<256U> *)in_stack_fffffffffffff7b0);
    base_blob<256u>::ToString_abi_cxx11_((base_blob<256U> *)in_stack_fffffffffffff7b0);
    in_stack_fffffffffffff7b8 = "in2.ToString()";
    in_stack_fffffffffffff7b0 = (ArgsManager *)local_298;
    in_stack_fffffffffffff7a8 = "res3.ToString()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
              (local_6d0,local_6e0,0xf3,1,2,local_298 + 0x20);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff7a8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff7a8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff7a8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  CDBWrapper::~CDBWrapper(this_00);
  std::unique_ptr<CDBWrapper,_std::default_delete<CDBWrapper>_>::~unique_ptr
            ((unique_ptr<CDBWrapper,_std::default_delete<CDBWrapper>_> *)in_stack_fffffffffffff7b8);
  fs::path::~path((path *)in_stack_fffffffffffff7a8);
  if (*(size_type *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(existing_data_no_obfuscate)
{
    // We're going to share this fs::path between two wrappers
    fs::path ph = m_args.GetDataDirBase() / "existing_data_no_obfuscate";
    fs::create_directories(ph);

    // Set up a non-obfuscated wrapper to write some initial data.
    std::unique_ptr<CDBWrapper> dbw = std::make_unique<CDBWrapper>(DBParams{.path = ph, .cache_bytes = 1 << 10, .memory_only = false, .wipe_data = false, .obfuscate = false});
    uint8_t key{'k'};
    uint256 in = m_rng.rand256();
    uint256 res;

    BOOST_CHECK(dbw->Write(key, in));
    BOOST_CHECK(dbw->Read(key, res));
    BOOST_CHECK_EQUAL(res.ToString(), in.ToString());

    // Call the destructor to free leveldb LOCK
    dbw.reset();

    // Now, set up another wrapper that wants to obfuscate the same directory
    CDBWrapper odbw({.path = ph, .cache_bytes = 1 << 10, .memory_only = false, .wipe_data = false, .obfuscate = true});

    // Check that the key/val we wrote with unobfuscated wrapper exists and
    // is readable.
    uint256 res2;
    BOOST_CHECK(odbw.Read(key, res2));
    BOOST_CHECK_EQUAL(res2.ToString(), in.ToString());

    BOOST_CHECK(!odbw.IsEmpty()); // There should be existing data
    BOOST_CHECK(is_null_key(dbwrapper_private::GetObfuscateKey(odbw))); // The key should be an empty string

    uint256 in2 = m_rng.rand256();
    uint256 res3;

    // Check that we can write successfully
    BOOST_CHECK(odbw.Write(key, in2));
    BOOST_CHECK(odbw.Read(key, res3));
    BOOST_CHECK_EQUAL(res3.ToString(), in2.ToString());
}